

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O3

void SequenceSpanTask::initialize(search *sch,size_t *num_actions,options_i *options)

{
  v_array<unsigned_int> *this;
  int *piVar1;
  option_group_definition *this_00;
  typed_option<unsigned_long> *op;
  bool search_span_bilou;
  option_group_definition new_options;
  bool local_261;
  search *local_260;
  unsigned_long *local_258;
  options_i *local_250;
  string local_248;
  string local_228;
  option_group_definition local_208;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 local_190 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  typed_option<unsigned_long> local_d0;
  
  local_260 = sch;
  piVar1 = (int *)operator_new(0x50);
  piVar1[0] = 0;
  piVar1[1] = 0;
  piVar1[2] = 0;
  piVar1[3] = 0;
  piVar1[4] = 0;
  piVar1[5] = 0;
  piVar1[6] = 0;
  piVar1[7] = 0;
  piVar1[8] = 0;
  piVar1[9] = 0;
  piVar1[10] = 0;
  piVar1[0xb] = 0;
  piVar1[0xc] = 0;
  piVar1[0xd] = 0;
  piVar1[0xe] = 0;
  piVar1[0xf] = 0;
  piVar1[0x10] = 0;
  piVar1[0x11] = 0;
  piVar1[0x12] = 0;
  piVar1[0x13] = 0;
  local_261 = false;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"search sequencespan options","");
  local_208.m_name._M_dataplus._M_p = (pointer)&local_208.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_208,local_f0,local_f0 + local_e8);
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_250 = options;
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"search_span_bilou","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_190,&local_228,&local_261);
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"switch to (internal) BILOU encoding instead of BIO encoding","");
  std::__cxx11::string::_M_assign((string *)(local_190 + 0x30));
  this_00 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                      (&local_208,(typed_option<bool> *)local_190);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"search_span_multipass","");
  local_258 = (unsigned_long *)(piVar1 + 0x12);
  VW::config::typed_option<unsigned_long>::typed_option(&local_d0,&local_248,local_258);
  op = VW::config::typed_option<unsigned_long>::default_value(&local_d0,1);
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"do multiple passes","");
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>(this_00,op);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0]);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d7e00;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0]);
  }
  local_190._0_8_ = &PTR__typed_option_002d5f10;
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
  }
  if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  (**local_250->_vptr_options_i)(local_250,&local_208);
  if (local_261 == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"switching to BILOU encoding for sequence span labeling",0x36);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    *piVar1 = 1;
    *num_actions = *num_actions * 2 - 1;
  }
  else {
    *piVar1 = 0;
  }
  this = (v_array<unsigned_int> *)(piVar1 + 2);
  v_array<unsigned_int>::clear(this);
  if (*piVar1 == 1) {
    local_190._0_4_ = 1;
    v_array<unsigned_int>::push_back(this,(uint *)local_190);
    local_190._0_4_ = 2;
    if (2 < *num_actions) {
      do {
        v_array<unsigned_int>::push_back(this,(uint *)local_190);
        local_d0.super_base_option._vptr_base_option =
             (_func_int **)
             CONCAT44(local_d0.super_base_option._vptr_base_option._4_4_,local_190._0_4_ + 1);
        v_array<unsigned_int>::push_back(this,(uint *)&local_d0);
        local_190._0_4_ = local_190._0_4_ + 4;
      } while ((ulong)(uint)local_190._0_4_ < *num_actions);
    }
    local_190._0_4_ = 0;
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(piVar1 + 10),(uint *)local_190);
    local_190._0_8_ = (ulong)(uint)local_190._4_4_ << 0x20;
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(piVar1 + 10),(uint *)local_190);
  }
  else if (*piVar1 == 0) {
    local_190._0_4_ = 1;
    v_array<unsigned_int>::push_back(this,(uint *)local_190);
    local_190._0_4_ = 2;
    if (2 < *num_actions) {
      do {
        v_array<unsigned_int>::push_back(this,(uint *)local_190);
        local_190._0_4_ = local_190._0_4_ + 2;
      } while ((ulong)(uint)local_190._0_4_ < *num_actions);
    }
    local_190._0_4_ = 1;
    v_array<unsigned_int>::push_back(this,(uint *)local_190);
  }
  local_260->task_data = piVar1;
  Search::search::set_options
            (local_260,
             Search::AUTO_HAMMING_LOSS | Search::AUTO_CONDITION_FEATURES |
             Search::EXAMPLES_DONT_CHANGE);
  Search::search::set_num_learners(local_260,*local_258);
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_208.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_name._M_dataplus._M_p != &local_208.m_name.field_2) {
    operator_delete(local_208.m_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i& options)
{
  task_data* D = new task_data();

  bool search_span_bilou = false;
  option_group_definition new_options("search sequencespan options");
  new_options
      .add(make_option("search_span_bilou", search_span_bilou)
               .help("switch to (internal) BILOU encoding instead of BIO encoding"))
      .add(make_option("search_span_multipass", D->multipass).default_value(1).help("do multiple passes"));
  options.add_and_parse(new_options);

  if (search_span_bilou)
  {
    cerr << "switching to BILOU encoding for sequence span labeling" << endl;
    D->encoding = BILOU;
    num_actions = num_actions * 2 - 1;
  }
  else
    D->encoding = BIO;

  D->allowed_actions.clear();

  if (D->encoding == BIO)
  {
    D->allowed_actions.push_back(1);
    for (action l = 2; l < num_actions; l += 2) D->allowed_actions.push_back(l);
    D->allowed_actions.push_back(1);  // push back an extra 1 that we can overwrite later if we want
  }
  else if (D->encoding == BILOU)
  {
    D->allowed_actions.push_back(1);
    for (action l = 2; l < num_actions; l += 4)
    {
      D->allowed_actions.push_back(l);
      D->allowed_actions.push_back(l + 1);
    }
    D->only_two_allowed.push_back(0);
    D->only_two_allowed.push_back(0);
  }

  sch.set_task_data<task_data>(D);
  sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
      Search::AUTO_HAMMING_LOSS |     // please just use hamming loss on individual predictions -- we won't declare loss
      Search::EXAMPLES_DONT_CHANGE |  // we don't do any internal example munging
      0);
  sch.set_num_learners(D->multipass);
}